

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

void __thiscall RTVector3::normalize(RTVector3 *this)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  
  uVar2 = *(ulong *)this->m_data;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar2;
  fVar5 = (float)(uVar2 >> 0x20);
  fVar1 = this->m_data[2];
  fVar5 = SQRT(fVar1 * fVar1 + (float)uVar2 * (float)uVar2 + fVar5 * fVar5);
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    return;
  }
  auVar3._4_4_ = fVar5;
  auVar3._0_4_ = fVar5;
  auVar3._8_8_ = 0;
  auVar4 = divps(auVar4,auVar3);
  *(long *)this->m_data = auVar4._0_8_;
  this->m_data[2] = fVar1 / fVar5;
  return;
}

Assistant:

void RTVector3::normalize()
{
    RTFLOAT length = sqrt(m_data[0] * m_data[0] + m_data[1] * m_data[1] +
            m_data[2] * m_data[2]);

    if (length == 0)
        return;

    m_data[0] /= length;
    m_data[1] /= length;
    m_data[2] /= length;
}